

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void * list_remove(List *list,uint index)

{
  ListNode *__ptr;
  void *data;
  ListNode *node;
  uint index_local;
  List *list_local;
  
  if (index < list->size) {
    __ptr = list_get_(list,index);
    if (__ptr == (ListNode *)0x0) {
      list_local = (List *)0x0;
    }
    else {
      if (index == 0) {
        list->head = __ptr->next;
      }
      else if (index == list->size - 1) {
        list->tail = __ptr->prev;
        __ptr->prev->next = (list_node_ *)0x0;
      }
      else {
        __ptr->prev->next = __ptr->next;
        __ptr->next->prev = __ptr->prev;
      }
      list->size = list->size - 1;
      list_local = (List *)__ptr->data;
      free(__ptr);
      if (list->size == 0) {
        list->tail = (ListNode *)0x0;
        list->head = (ListNode *)0x0;
      }
    }
  }
  else {
    list_local = (List *)0x0;
  }
  return list_local;
}

Assistant:

void* list_remove(List * list, unsigned int index){
    if (index >= list->size){
        return NULL;
    }
    ListNode *node = list_get_(list, index);
    if (node == NULL)
        return NULL;
    if (index == 0){
        /**
         * 删除头
         */
        list->head = node->next;
    }else if (index == list->size - 1){
        // 删除尾
        list->tail = node->prev;
        node->prev->next = NULL;
    }else{
        node->prev->next = node->next;
        node->next->prev = node->prev;
    }
    list->size --;
    void* data = node->data;
    free(node);
    // 防止出现野指针
    if (list->size == 0){
        list->head = list->tail = NULL;
    }
    return data;
}